

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

_Bool BitmapSetPixelColor(Bitmap *bitmap,uint16_t x,uint16_t y,RGBTRIPLE *color)

{
  uint8_t uVar1;
  RGBTRIPLE *pRVar2;
  RGBTRIPLE *color_local;
  uint16_t y_local;
  uint16_t x_local;
  Bitmap *bitmap_local;
  
  if ((x < (bitmap->dibHeader).bcWidth) && (y < (bitmap->dibHeader).bcHeight)) {
    pRVar2 = bitmap->pixels +
             (int)((uint)x +
                  (uint)(bitmap->dibHeader).bcWidth *
                  (((uint)(bitmap->dibHeader).bcHeight - (uint)y) + -1));
    uVar1 = color->rgbtGreen;
    pRVar2->rgbtBlue = color->rgbtBlue;
    pRVar2->rgbtGreen = uVar1;
    pRVar2->rgbtRed = color->rgbtRed;
    bitmap_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"%s: Invalid pixel indices (x:%d<%d, y:%d<%d)\n","BitmapSetPixelColor",(ulong)x,
            (ulong)(bitmap->dibHeader).bcWidth,(ulong)y,(uint)(bitmap->dibHeader).bcHeight);
    bitmap_local._7_1_ = false;
  }
  return bitmap_local._7_1_;
}

Assistant:

bool BitmapSetPixelColor(Bitmap *bitmap, uint16_t x, uint16_t y, const RGBTRIPLE *color) {
  if (bitmap->dibHeader.bcWidth <= x || bitmap->dibHeader.bcHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid pixel indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, bitmap->dibHeader.bcWidth, y, bitmap->dibHeader.bcHeight);
#endif
    return false;
  }
  bitmap->pixels[x + bitmap->dibHeader.bcWidth * (bitmap->dibHeader.bcHeight - y - 1)] = *color;
  return true;
}